

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash.h
# Opt level: O0

uint64_t util::Hash128to64(uint128_t x)

{
  uint128_t x_00;
  uint64_t uVar1;
  uint64_t uVar2;
  ulong uVar3;
  unsigned_long extraout_RDX;
  unsigned_long extraout_RDX_00;
  unsigned_long in_RSI;
  util *in_RDI;
  uint128_t x_01;
  uint128_t x_02;
  uint64_t b;
  uint64_t a;
  uint64_t kMul;
  
  x_00.second = in_RSI;
  x_00.first = (unsigned_long)in_RDI;
  uVar1 = Uint128Low64(x_00);
  x_01.second = extraout_RDX;
  x_01.first = in_RSI;
  uVar2 = Uint128High64(in_RDI,x_01);
  uVar3 = (uVar1 ^ uVar2) * -0x622015f714c7d297;
  x_02.second = extraout_RDX_00;
  x_02.first = in_RSI;
  uVar1 = Uint128High64(in_RDI,x_02);
  uVar3 = (uVar1 ^ uVar3 >> 0x2f ^ uVar3) * -0x622015f714c7d297;
  return (uVar3 >> 0x2f ^ uVar3) * -0x622015f714c7d297;
}

Assistant:

inline uint64_t Hash128to64(uint128_t x) {
  // Murmur-inspired hashing.
  const uint64_t kMul = 0x9ddfea08eb382d69ULL;
  uint64_t a = (Uint128Low64(x) ^ Uint128High64(x)) * kMul;
  a ^= (a >> 47);
  uint64_t b = (Uint128High64(x) ^ a) * kMul;
  b ^= (b >> 47);
  b *= kMul;
  return b;
}